

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintRawArrayTo<unsigned_char>(uchar *a,size_t cnt,iu_ostream *os)

{
  size_t i;
  ulong uVar1;
  
  UniversalPrintTo<unsigned_char>(a,os);
  for (uVar1 = 1; uVar1 < cnt; uVar1 = uVar1 + 1) {
    std::operator<<(os,", ");
    UniversalPrintTo<unsigned_char>(a + uVar1,os);
  }
  return;
}

Assistant:

inline void PrintRawArrayTo(const T* a, size_t cnt, iu_ostream* os)
{
    UniversalPrint<T>(a[0], os);
    for( size_t i=1; i < cnt; ++i )
    {
        *os << ", ";
        UniversalPrint<T>(a[i], os);
    }
}